

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::~Builder(Builder *this)

{
  Vector<Instruction_*> *local_38;
  Vector<Instruction_*> *local_18;
  Builder *this_local;
  
  this->_vptr_Builder = (_func_int **)&PTR__Builder_00339cf8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_unsigned_int>_>_>
  ::~vector(&this->importIDCache);
  std::
  stack<spv::Builder::LoopBlocks,_std::deque<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>_>
  ::~stack(&this->loops);
  std::stack<spv::Block_*,_std::deque<spv::Block_*,_std::allocator<spv::Block_*>_>_>::~stack
            (&this->switchMerges);
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::~vector
            (&this->coopmatTypes);
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::~vector
            (&this->coopmatConstants);
  local_18 = &this->coopmatConstants;
  do {
    local_18 = local_18 + -1;
    std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::~vector
              (local_18);
  } while (local_18 != this->groupedTypes);
  local_38 = this->groupedTypes;
  do {
    local_38 = local_38 + -1;
    std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::~vector
              (local_38);
  } while (local_38 != this->groupedConstants);
  std::
  vector<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Function,_std::default_delete<spv::Function>_>_>_>
  ::~vector(&this->functions);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->externals);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->constantsTypesGlobals);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->decorations);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->lines);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->names);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->executionModes);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->entryPoints);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->imports);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::~vector(&this->strings);
  AccessChain::~AccessChain(&this->accessChain);
  Module::~Module(&this->module);
  std::
  set<spv::Capability,_std::less<spv::Capability>,_dxil_spv::ThreadLocalAllocator<spv::Capability>_>
  ::~set(&this->capabilities);
  std::vector<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>::~vector
            (&this->moduleProcesses);
  std::vector<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>::~vector
            (&this->sourceExtensions);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ::~set(&this->extensions);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  ~basic_string(&this->sourceText);
  return;
}

Assistant:

Builder::~Builder()
{
}